

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O3

void __thiscall Refal2::CReceptacle::DigOut(CReceptacle *this,CUnitList *key,CUnitList *value)

{
  CNodeType *pCVar1;
  CNodeType *fromNode;
  CUnitNode *fromNode_00;
  bool bVar2;
  CUnitNode *leftBorderNode;
  CUnitNode *local_38;
  CUnitNode *local_30;
  
  local_30 = (CNodeType *)0x0;
  local_38 = (CUnitNode *)0x0;
  bVar2 = find(this,(key->super_CNodeList<Refal2::CUnit>).first,&local_30,&local_38);
  fromNode_00 = local_30;
  if (bVar2) {
    pCVar1 = (local_30->super_CUnit).field_1.pairedParen;
    fromNode = local_38->next;
    if (fromNode != pCVar1) {
      pCVar1 = pCVar1->prev;
      CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this,fromNode,pCVar1);
      CNodeList<Refal2::CUnit>::Assign(&value->super_CNodeList<Refal2::CUnit>,fromNode,pCVar1);
      CNodeList<Refal2::CUnit>::Remove
                ((CNodeList<Refal2::CUnit> *)this,fromNode_00,
                 (fromNode_00->super_CUnit).field_1.pairedParen);
      return;
    }
  }
  pCVar1 = (value->super_CNodeList<Refal2::CUnit>).first;
  if (pCVar1 != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Remove
              (&value->super_CNodeList<Refal2::CUnit>,pCVar1,
               (value->super_CNodeList<Refal2::CUnit>).last);
  }
  (value->super_CNodeList<Refal2::CUnit>).first = (CNodeType *)0x0;
  (value->super_CNodeList<Refal2::CUnit>).last = (CNodeType *)0x0;
  return;
}

Assistant:

void CReceptacle::DigOut( const CUnitList& key, CUnitList& value )
{
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( key.GetFirst(), leftBorderNode, equalNode ) ) {
		CUnitNode* rightBorderNode = leftBorderNode->PairedParen();
		equalNode = equalNode->Next();
		if( equalNode != rightBorderNode ) {
			rightBorderNode = rightBorderNode->Prev();
			data.Detach( equalNode, rightBorderNode );
			value.Assign( equalNode, rightBorderNode );
			data.Remove( leftBorderNode, leftBorderNode->PairedParen() );
			return;
		}
	}
	value.Empty();	
}